

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAnnotationObjectHelper.cc
# Opt level: O3

QPDFObjectHandle __thiscall
QPDFAnnotationObjectHelper::getAppearanceStream
          (QPDFAnnotationObjectHelper *this,string *which,string *state)

{
  long lVar1;
  long lVar2;
  element_type *this_00;
  bool bVar3;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  QPDFObjectHandle QVar5;
  QPDFObjectHandle ap;
  string desired_state;
  undefined1 local_68 [24];
  undefined1 local_50 [16];
  string local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  getAppearanceDictionary((QPDFAnnotationObjectHelper *)(local_68 + 0x18));
  lVar1 = ((long *)CONCAT71(in_register_00000009,in_CL))[1];
  if (lVar1 == 0) {
    getAppearanceState_abi_cxx11_((string *)(local_50 + 0x10),(QPDFAnnotationObjectHelper *)which);
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    lVar2 = *(long *)CONCAT71(in_register_00000009,in_CL);
    std::__cxx11::string::_M_construct<char*>((string *)(local_50 + 0x10),lVar2,lVar1 + lVar2);
  }
  bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_68 + 0x18));
  if (bVar3) {
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_68,(string *)(local_68 + 0x18));
    bVar3 = QPDFObjectHandle::isStream((QPDFObjectHandle *)local_68);
    if (bVar3) {
      (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper = (_func_int **)local_68._0_8_;
      (this->super_QPDFObjectHelper).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_68._8_8_;
      _Var4._M_pi = extraout_RDX;
      goto LAB_0015b834;
    }
    bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_68);
    if (bVar3 && local_40._M_string_length != 0) {
      QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_68);
      bVar3 = QPDFObjectHandle::isStream((QPDFObjectHandle *)this);
      if (bVar3) {
        _Var4._M_pi = extraout_RDX_00;
        if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
          _Var4._M_pi = extraout_RDX_01;
        }
        goto LAB_0015b834;
      }
      this_00 = (this->super_QPDFObjectHelper).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (this_00 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
    }
    if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    }
  }
  QVar5 = QPDFObjectHandle::newNull();
  _Var4._M_pi = QVar5.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
LAB_0015b834:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    _Var4._M_pi = extraout_RDX_02;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
    _Var4._M_pi = extraout_RDX_03;
  }
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFAnnotationObjectHelper::getAppearanceStream(std::string const& which, std::string const& state)
{
    QPDFObjectHandle ap = getAppearanceDictionary();
    std::string desired_state = state.empty() ? getAppearanceState() : state;
    if (ap.isDictionary()) {
        QPDFObjectHandle ap_sub = ap.getKey(which);
        if (ap_sub.isStream()) {
            // According to the spec, Appearance State is supposed to refer to a subkey of the
            // appearance stream when /AP is a dictionary, but files have been seen in the wild
            // where Appearance State is `/N` and `/AP` is a stream. Therefore, if `which` points to
            // a stream, disregard state and just use the stream. See qpdf issue #949 for details.
            QTC::TC("qpdf", "QPDFAnnotationObjectHelper AP stream");
            return ap_sub;
        }
        if (ap_sub.isDictionary() && (!desired_state.empty())) {
            QTC::TC("qpdf", "QPDFAnnotationObjectHelper AP dictionary");
            QPDFObjectHandle ap_sub_val = ap_sub.getKey(desired_state);
            if (ap_sub_val.isStream()) {
                QTC::TC("qpdf", "QPDFAnnotationObjectHelper AP sub stream");
                return ap_sub_val;
            }
        }
    }
    QTC::TC("qpdf", "QPDFAnnotationObjectHelper AP null");
    return QPDFObjectHandle::newNull();
}